

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_xmlmodelserialiser.cpp
# Opt level: O3

void __thiscall tst_XmlModelSerialiser::basicSaveLoadStream(tst_XmlModelSerialiser *this)

{
  QAbstractItemModel *a;
  QAbstractItemModel *b;
  bool bVar1;
  char cVar2;
  __atomic_base<int> _Var3;
  undefined8 *puVar4;
  QXmlStreamReader readStream;
  QXmlStreamWriter writeStream;
  QTemporaryFile serialisedXmlStream;
  XmlModelSerialiser serialiser;
  QXmlStreamReader aQStack_88 [8];
  QXmlStreamWriter local_80 [8];
  long local_78 [2];
  QMetaTypeInterface *local_68 [3];
  QModelIndex local_50;
  QModelIndex local_38;
  
  local_68[0] = &QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType;
  _Var3._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId.
               _q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var3._M_i = QMetaType::idHelper();
  }
  puVar4 = (undefined8 *)QTest::qData("sourceModel",_Var3._M_i);
  a = (QAbstractItemModel *)*puVar4;
  local_68[0] = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var3._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var3._M_i = QMetaType::idHelper();
  }
  puVar4 = (undefined8 *)QTest::qData("destinationModel",_Var3._M_i);
  b = (QAbstractItemModel *)*puVar4;
  XmlModelSerialiser::XmlModelSerialiser((XmlModelSerialiser *)local_68,a,(QObject *)0x0);
  AbstractModelSerialiser::addRoleToSave((int)(XmlModelSerialiser *)local_68);
  QTemporaryFile::QTemporaryFile((QTemporaryFile *)local_78);
  bVar1 = (bool)(**(code **)(local_78[0] + 0x68))(local_78,3);
  cVar2 = QTest::qVerify(bVar1,"serialisedXmlStream.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                         ,0x36);
  if (cVar2 != '\0') {
    QXmlStreamWriter::QXmlStreamWriter(local_80,(QIODevice *)local_78);
    bVar1 = (bool)XmlModelSerialiser::saveModel((QXmlStreamWriter *)local_68);
    cVar2 = QTest::qVerify(bVar1,"serialiser.saveModel(writeStream)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                           ,0x38);
    if (cVar2 != '\0') {
      bVar1 = (bool)QFileDevice::seek((longlong)local_78);
      cVar2 = QTest::qVerify(bVar1,"serialisedXmlStream.seek(0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                             ,0x39);
      if (cVar2 != '\0') {
        QXmlStreamReader::QXmlStreamReader(aQStack_88,(QIODevice *)local_78);
        AbstractModelSerialiser::setModel((QAbstractItemModel *)local_68);
        bVar1 = (bool)XmlModelSerialiser::loadModel((QXmlStreamReader *)local_68);
        cVar2 = QTest::qVerify(bVar1,"serialiser.loadModel(readStream)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                               ,0x3c);
        if (cVar2 != '\0') {
          QFileDevice::close();
          local_38.r = -1;
          local_38.c = -1;
          local_38.i = 0;
          local_38.m = (QAbstractItemModel *)0x0;
          local_50.r = -1;
          local_50.c = -1;
          local_50.i = 0;
          local_50.m = (QAbstractItemModel *)0x0;
          tst_SerialiserCommon::checkModelEqual
                    (&this->super_tst_SerialiserCommon,a,b,&local_38,&local_50,true);
          QObject::deleteLater();
        }
        QXmlStreamReader::~QXmlStreamReader(aQStack_88);
      }
    }
    QXmlStreamWriter::~QXmlStreamWriter(local_80);
  }
  QTemporaryFile::~QTemporaryFile((QTemporaryFile *)local_78);
  XmlModelSerialiser::~XmlModelSerialiser((XmlModelSerialiser *)local_68);
  return;
}

Assistant:

void tst_XmlModelSerialiser::basicSaveLoadStream()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    XmlModelSerialiser serialiser(sourceModel, nullptr);
    serialiser.addRoleToSave(Qt::UserRole + 1);
    QTemporaryFile serialisedXmlStream;
    QVERIFY(serialisedXmlStream.open());
    QXmlStreamWriter writeStream(&serialisedXmlStream);
    QVERIFY(serialiser.saveModel(writeStream));
    QVERIFY(serialisedXmlStream.seek(0));
    QXmlStreamReader readStream(&serialisedXmlStream);
    serialiser.setModel(destinationModel);
    QVERIFY(serialiser.loadModel(readStream));
    serialisedXmlStream.close();
    checkModelEqual(sourceModel, destinationModel);
    destinationModel->deleteLater();
}